

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.cc
# Opt level: O1

string * __thiscall
flow::util::Flags::getString(string *__return_storage_ptr__,Flags *this,string *flag)

{
  pointer pcVar1;
  const_iterator cVar2;
  Error *pEVar3;
  string local_60;
  string local_40;
  
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<flow::util::Flags::FlagType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<flow::util::Flags::FlagType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->set_)._M_h,flag);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<flow::util::Flags::FlagType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pEVar3 = (Error *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    pcVar1 = (flag->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + flag->_M_string_length);
    Error::Error(pEVar3,NotFound,&local_40);
    __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
  }
  if (*(int *)((long)cVar2.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<flow::util::Flags::FlagType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                     ._M_cur + 0x28) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               *(long *)((long)cVar2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<flow::util::Flags::FlagType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                               ._M_cur + 0x30),
               *(long *)((long)cVar2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<flow::util::Flags::FlagType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                               ._M_cur + 0x38) +
               *(long *)((long)cVar2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<flow::util::Flags::FlagType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                               ._M_cur + 0x30));
    return __return_storage_ptr__;
  }
  pEVar3 = (Error *)__cxa_allocate_exception(0x38);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  pcVar1 = (flag->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + flag->_M_string_length);
  Error::Error(pEVar3,TypeMismatch,&local_60);
  __cxa_throw(pEVar3,&Error::typeinfo,Error::~Error);
}

Assistant:

std::string Flags::getString(const std::string& flag) const {
  auto i = set_.find(flag);
  if (i == set_.end())
    throw Error{ErrorCode::NotFound, flag};

  if (i->second.first != FlagType::String)
    throw Error{ErrorCode::TypeMismatch, flag};

  return i->second.second;
}